

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O1

void __thiscall FileTest_CloseError_Test::TestBody(FileTest_CloseError_Test *this)

{
  bool bVar1;
  int __fd;
  char *pcVar2;
  string_view message;
  file f;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  AssertHelper local_58;
  file local_4c;
  AssertionResult local_48;
  string local_38;
  
  open_file();
  close(local_4c.fd_);
  testing::AssertionSuccess();
  if (local_48.success_ == true) {
    __fd = 9;
    message.size_ = 0x11;
    message.data_ = "cannot close file";
    format_system_error_abi_cxx11_(&local_38,9,message);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::file::close(&local_4c,__fd);
    }
    testing::AssertionResult::operator<<
              (&local_48,
               (char (*) [96])
               "Expected: f.close() throws an exception of type fmt::system_error.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_38);
  if (local_48.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
             ,0x10f,pcVar2);
  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((long *)local_38._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
    local_38._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_48._0_4_ = 0xffffffff;
  local_58.data_._0_4_ = local_4c.fd_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_38,"-1","f.descriptor()",(int *)&local_48,(int *)&local_58);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
               ,0x110,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48._0_8_ + 8))();
      }
      local_48._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  fmt::v5::file::~file(&local_4c);
  return;
}

Assistant:

TEST(FileTest, CloseError) {
  file f = open_file();
  FMT_POSIX(close(f.descriptor()));
  EXPECT_SYSTEM_ERROR_NOASSERT(f.close(), EBADF, "cannot close file");
  EXPECT_EQ(-1, f.descriptor());
}